

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# externals.c
# Opt level: O1

char * ucrcourse_strerror(int error)

{
  char *pcVar1;
  
  if (error + 0x69U < 6) {
    return &DAT_0010a068 + *(int *)(&DAT_0010a068 + (ulong)(error + 0x69U) * 4);
  }
  pcVar1 = strerror(error);
  return pcVar1;
}

Assistant:

const char *ucrcourse_strerror(int error)
{
	switch (error) {
	case UCRCOURSE_ERR_INTERNAL:
		return "Internal library error";
	case UCRCOURSE_ERR_CURL:
		return "cURL returned an error";
	case UCRCOURSE_ERR_INVALID_ARG:
		return "Invalid argument(s)";
	case UCRCOURSE_ERR_CONNECT:
		return "Unable to connect to remote";
	case UCRCOURSE_ERR_SERVER:
		return "Remote server encountered an error";
	case UCRCOURSE_ERR_RESPONSE:
		return "Server response is malformed";
	default:
		return strerror(error);
	}
}